

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v5::internal::format_decimal<unsigned_int,char,fmt::v5::internal::no_thousands_sep>
                 (long buffer,uint value,uint num_digits)

{
  uint uVar1;
  uint index;
  uint index_1;
  char *end;
  uint num_digits_local;
  uint value_local;
  char *buffer_local;
  
  end._4_4_ = value;
  _num_digits_local = (char *)(buffer + (ulong)num_digits);
  while (99 < end._4_4_) {
    uVar1 = (end._4_4_ % 100) * 2;
    end._4_4_ = end._4_4_ / 100;
    _num_digits_local[-1] = basic_data<void>::DIGITS[uVar1 + 1];
    no_thousands_sep::operator()
              ((no_thousands_sep *)((long)&buffer_local + 7),_num_digits_local + -1);
    _num_digits_local[-2] = basic_data<void>::DIGITS[uVar1];
    no_thousands_sep::operator()
              ((no_thousands_sep *)((long)&buffer_local + 7),_num_digits_local + -2);
    _num_digits_local = _num_digits_local + -2;
  }
  if (end._4_4_ < 10) {
    _num_digits_local[-1] = (char)end._4_4_ + '0';
  }
  else {
    _num_digits_local[-1] = basic_data<void>::DIGITS[end._4_4_ * 2 + 1];
    no_thousands_sep::operator()
              ((no_thousands_sep *)((long)&buffer_local + 7),_num_digits_local + -1);
    _num_digits_local[-2] = basic_data<void>::DIGITS[end._4_4_ * 2];
  }
  return (char *)(buffer + (ulong)num_digits);
}

Assistant:

inline Char *format_decimal(Char *buffer, UInt value, unsigned num_digits,
                            ThousandsSep thousands_sep) {
  buffer += num_digits;
  Char *end = buffer;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    unsigned index = static_cast<unsigned>((value % 100) * 2);
    value /= 100;
    *--buffer = data::DIGITS[index + 1];
    thousands_sep(buffer);
    *--buffer = data::DIGITS[index];
    thousands_sep(buffer);
  }
  if (value < 10) {
    *--buffer = static_cast<char>('0' + value);
    return end;
  }
  unsigned index = static_cast<unsigned>(value * 2);
  *--buffer = data::DIGITS[index + 1];
  thousands_sep(buffer);
  *--buffer = data::DIGITS[index];
  return end;
}